

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<osqp::(anonymous_namespace)::ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test>
::CreateTest(ParameterizedTestFactory<osqp::(anonymous_namespace)::ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test>
             *this)

{
  ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test *this_00;
  Test *local_30;
  ParameterizedTestFactory<osqp::(anonymous_namespace)::ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test>
  *this_local;
  
  WithParamInterface<bool>::SetParam(&this->parameter_);
  this_00 = (ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test *)
            operator_new(0x20);
  osqp::anon_unknown_0::
  ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test::
  ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test(this_00);
  local_30 = (Test *)0x0;
  if (this_00 !=
      (ParameterizedTwoDimensionalQpTest_SolvesWithNewObjectiveAndConstraintMatrices_Test *)0x0) {
    local_30 = &(this_00->super_ParameterizedTwoDimensionalQpTest).super_TwoDimensionalQpTest.
                super_Test;
  }
  return local_30;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }